

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O1

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::update
          (QRotationGate2<std::complex<float>_> *this,real_type theta)

{
  int iVar1;
  float fVar2;
  
  iVar1 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[1])();
  if ((char)iVar1 == '\0') {
    fVar2 = cosf(theta * 0.5);
    (this->rotation_).angle_.cos_ = fVar2;
    fVar2 = sinf(theta * 0.5);
    (this->rotation_).angle_.sin_ = fVar2;
    return;
  }
  __assert_fail("!fixed()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QRotationGate2.hpp"
                ,0xbd,
                "void qclab::qgates::QRotationGate2<std::complex<float>>::update(const real_type) [T = std::complex<float>]"
               );
}

Assistant:

void update( const real_type theta ) {
          assert( !fixed() ) ;
          rotation_.update( theta ) ;
        }